

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O3

bool __thiscall DTreePropagator::propagateNewNode(DTreePropagator *this,int n)

{
  ulong *puVar1;
  pointer pvVar2;
  uint *puVar3;
  bool bVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  
  bVar4 = DReachabilityPropagator::propagateNewNode(&this->super_DReachabilityPropagator,n);
  if (bVar4) {
    uVar7 = (ulong)n;
    pvVar2 = (this->super_DReachabilityPropagator).in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (uint *)pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar6 = *(uint **)&pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar6 != puVar3; puVar6 = puVar6 + 1) {
      (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
        _vptr_Propagator[0x19])(this,(ulong)*puVar6);
    }
    pvVar2 = (this->super_DReachabilityPropagator).ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (uint *)pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar6 = *(uint **)&pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar6 != puVar3; puVar6 = puVar6 + 1) {
      (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
        _vptr_Propagator[0x19])(this,(ulong)*puVar6);
    }
    uVar5 = uVar7 + 0x3f;
    if (-1 < (long)uVar7) {
      uVar5 = uVar7;
    }
    puVar1 = (this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
             ((long)uVar5 >> 6) +
             (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)n & 0x3f);
  }
  return bVar4;
}

Assistant:

bool DTreePropagator::propagateNewNode(int n) {
	if (!DReachabilityPropagator::propagateNewNode(n)) {
		return false;
	}

	for (const int i : in[n]) {
		prevent_cycle(i);
	}
	for (const int i : ou[n]) {
		prevent_cycle(i);
	}

	processed_n[n] = true;

	return true;
}